

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_HTML.h
# Opt level: O3

HTMLElement * __thiscall
choc::html::HTMLElement::setProperty(HTMLElement *this,string *propertyName,string_view value)

{
  pointer pcVar1;
  undefined8 *puVar2;
  long *plVar3;
  size_type *psVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined1 in_R8B;
  string_view text;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_a8;
  ulong local_a0;
  long local_98;
  undefined8 uStack_90;
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pcVar1 = (propertyName->_M_dataplus)._M_p;
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,pcVar1 + propertyName->_M_string_length);
  std::__cxx11::string::append((char *)&local_88);
  text._M_str = (char *)0x1;
  text._M_len = (size_t)value._M_str;
  escapeHTMLString_abi_cxx11_(&local_68,(HTMLElement *)value._M_len,text,(bool)in_R8B);
  uVar5 = 0xf;
  if (local_88 != local_78) {
    uVar5 = local_78[0];
  }
  if (uVar5 < local_68._M_string_length + local_80) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      uVar6 = local_68.field_2._M_allocated_capacity;
    }
    if (local_68._M_string_length + local_80 <= (ulong)uVar6) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_88);
      goto LAB_00263de3;
    }
  }
  puVar2 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_68._M_dataplus._M_p);
LAB_00263de3:
  local_a8 = &local_98;
  plVar3 = puVar2 + 2;
  if ((long *)*puVar2 == plVar3) {
    local_98 = *plVar3;
    uStack_90 = puVar2[3];
  }
  else {
    local_98 = *plVar3;
    local_a8 = (long *)*puVar2;
  }
  local_a0 = puVar2[1];
  *puVar2 = plVar3;
  puVar2[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_a8,local_a0,0,'\x01');
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_48.field_2._M_allocated_capacity = *psVar4;
    local_48.field_2._8_8_ = plVar3[3];
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  }
  else {
    local_48.field_2._M_allocated_capacity = *psVar4;
    local_48._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_48._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->properties,
             &local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  return this;
}

Assistant:

HTMLElement& setProperty (const std::string& propertyName, std::string_view value)
    {
        properties.push_back (propertyName + "=\"" + escapeHTMLString (value, true) + '"');
        return *this;
    }